

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

void __thiscall CServerBrowser::Refresh(CServerBrowser *this,int RefreshFlags)

{
  long lVar1;
  CServerEntry *pCVar2;
  int iVar3;
  int64 iVar4;
  long lVar5;
  NETADDR *Addr;
  CServerEntry **ppCVar6;
  long in_FS_OFFSET;
  CNetChunk Packet;
  CPacker Packer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_RefreshFlags = this->m_RefreshFlags | RefreshFlags;
  if ((RefreshFlags & 2U) != 0) {
    CServerlist::Clear(this->m_aServerlist + 1);
    if (this->m_ActServerlistType == 1) {
      CServerBrowserFilter::Clear(&this->m_ServerBrowserFilter);
    }
    iVar3 = random_int();
    this->m_CurrentLanToken = iVar3;
    CPacker::Reset(&Packer);
    CPacker::AddRaw(&Packer,SERVERBROWSE_GETINFO,8);
    CPacker::AddInt(&Packer,this->m_CurrentLanToken);
    mem_zero(&Packet,0x30);
    Packet.m_Address.type = (this->m_pNetClient->super_CNetBase).m_Socket.type | 4;
    Packet.m_ClientID = -1;
    Packet.m_Flags = 2;
    Packet.m_DataSize = (int)Packer.m_pCurrent - (int)&Packer;
    Packet.m_pData = &Packer;
    iVar4 = time_get();
    this->m_BroadcastTime = iVar4;
    for (iVar3 = -8; iVar3 != 0; iVar3 = iVar3 + 1) {
      Packet.m_Address.port = (short)iVar3 + 0x2077;
      CNetClient::Send(this->m_pNetClient,&Packet,0xffffffff,(CSendCBData *)0x0);
    }
    if (this->m_pConfig->m_Debug != 0) {
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,2,"client_srvbrowse","broadcasting for servers");
    }
  }
  if ((RefreshFlags & 1U) != 0) {
    ppCVar6 = &this->m_pFirstReqServer;
    while (pCVar2 = *ppCVar6, pCVar2 != (CServerEntry *)0x0) {
      CNetClient::PurgeStoredPacket(this->m_pNetClient,pCVar2->m_TrackID);
      ppCVar6 = &pCVar2->m_pNextReq;
    }
    CServerlist::Clear(this->m_aServerlist);
    if (this->m_ActServerlistType == 0) {
      CServerBrowserFilter::Clear(&this->m_ServerBrowserFilter);
    }
    this->m_pFirstReqServer = (CServerEntry *)0x0;
    this->m_pLastReqServer = (CServerEntry *)0x0;
    this->m_NumRequests = 0;
    this->m_NeedRefresh = 1;
    Addr = &(this->m_ServerBrowserFavorites).m_aFavoriteServers[0].m_Addr;
    for (lVar5 = 0; lVar5 < (this->m_ServerBrowserFavorites).m_NumFavoriteServers; lVar5 = lVar5 + 1
        ) {
      if (2 < (int)Addr[1].type) {
        Set(this,Addr,2,-1,(CServerInfo *)0x0);
      }
      Addr = (NETADDR *)&Addr[7].port;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::Refresh(int RefreshFlags)
{
	m_RefreshFlags |= RefreshFlags;

	if(RefreshFlags&IServerBrowser::REFRESHFLAG_LAN)
	{
		// clear out everything
		m_aServerlist[IServerBrowser::TYPE_LAN].Clear();
		if(m_ActServerlistType == IServerBrowser::TYPE_LAN)
			m_ServerBrowserFilter.Clear();

		// next token
		m_CurrentLanToken = GetNewToken();

		CPacker Packer;
		Packer.Reset();
		Packer.AddRaw(SERVERBROWSE_GETINFO, sizeof(SERVERBROWSE_GETINFO));
		Packer.AddInt(m_CurrentLanToken);

		/* do the broadcast version */
		CNetChunk Packet;
		mem_zero(&Packet, sizeof(Packet));
		Packet.m_Address.type = m_pNetClient->NetType()|NETTYPE_LINK_BROADCAST;
		Packet.m_ClientID = -1;
		Packet.m_Flags = NETSENDFLAG_CONNLESS;
		Packet.m_DataSize = Packer.Size();
		Packet.m_pData = Packer.Data();
		m_BroadcastTime = time_get();

		for(int Port = LAN_PORT_BEGIN; Port <= LAN_PORT_END; Port++)
		{
			Packet.m_Address.port = Port;
			m_pNetClient->Send(&Packet);
		}

		if(Config()->m_Debug)
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client_srvbrowse", "broadcasting for servers");
	}

	if(RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET)
	{
		// clear out everything
		for(CServerEntry *pEntry = m_pFirstReqServer; pEntry; pEntry = pEntry->m_pNextReq)
		{
			m_pNetClient->PurgeStoredPacket(pEntry->m_TrackID);
		}
		m_aServerlist[IServerBrowser::TYPE_INTERNET].Clear();
		if(m_ActServerlistType == IServerBrowser::TYPE_INTERNET)
			m_ServerBrowserFilter.Clear();
		m_pFirstReqServer = 0;
		m_pLastReqServer = 0;
		m_NumRequests = 0;

		m_NeedRefresh = 1;
		for(int i = 0; i < m_ServerBrowserFavorites.m_NumFavoriteServers; i++)
			if(m_ServerBrowserFavorites.m_aFavoriteServers[i].m_State >= CServerBrowserFavorites::FAVSTATE_ADDR)
				Set(m_ServerBrowserFavorites.m_aFavoriteServers[i].m_Addr, SET_FAV_ADD, -1, 0);
	}
}